

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

Error * ot::commissioner::ReadPemFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  ErrorCode EVar1;
  Error *pEVar2;
  string str;
  allocator_type local_69;
  string local_68;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  ReadFile((Error *)local_48,&local_68,aFilename);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_68._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_68._M_dataplus._M_p + local_68._M_string_length),&local_69);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (aData,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    local_48[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (aData,local_48);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Error ReadPemFile(ByteArray &aData, const std::string &aFilename)
{
    Error error;

    std::string str;

    SuccessOrExit(error = ReadFile(str, aFilename));

    aData = {str.begin(), str.end()};
    aData.push_back('\0');

exit:
    return error;
}